

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void primary(Vm *vm)

{
  Token *pTVar1;
  Token *pTVar2;
  Scanner *pSVar3;
  char **ppcVar4;
  uint uVar5;
  size_t sVar6;
  CallFrame *pCVar7;
  double value;
  long lVar8;
  HTItemKey key;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 *puVar13;
  ValueType VVar14;
  uint32_t uVar15;
  ulong uVar16;
  ObjString *object;
  TokenType TVar17;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar18;
  size_t sVar19;
  char *__nptr;
  undefined8 *puVar20;
  uint8_t uVar21;
  char cVar22;
  char *pcVar23;
  CodeBuffer *code_buffer;
  Vm *pVVar24;
  uint32_t uVar25;
  CallFrame ***pppCVar26;
  uint8_t index_1;
  undefined1 auVar27 [16];
  Variable VVar28;
  CrispyValue CVar29;
  CrispyValue value_00;
  CrispyValue value_01;
  code *pcStack_70;
  undefined8 local_68;
  Token local_60;
  undefined1 *local_40;
  Vm *local_38;
  undefined1 auVar9 [12];
  
  puVar20 = &local_68;
  pVVar24 = (Vm *)&vm->compiler;
  TVar17 = (vm->compiler).token.type;
  local_38 = pVVar24;
  if (0x15 < (int)TVar17) {
    if ((int)TVar17 < 0x1f) {
      if (TVar17 == TOKEN_OPEN_BRACE) {
        TVar17 = (((Compiler *)pVVar24)->token).type;
        uVar12 = *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4;
        pcVar23 = (vm->compiler).token.start;
        uVar15 = (vm->compiler).token.line;
        uVar11 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
        (vm->compiler).previous.length = (vm->compiler).token.length;
        (vm->compiler).previous.line = uVar15;
        *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
        (vm->compiler).previous.type = TVar17;
        *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar12;
        (vm->compiler).previous.start = pcVar23;
        uVar11 = *(undefined4 *)&(vm->compiler).next.field_0x4;
        pcVar23 = (vm->compiler).next.start;
        sVar19 = (vm->compiler).next.length;
        uVar15 = (vm->compiler).next.line;
        uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        (((Compiler *)pVVar24)->token).type = (vm->compiler).next.type;
        *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4 = uVar11;
        (vm->compiler).token.start = pcVar23;
        (vm->compiler).token.length = sVar19;
        (vm->compiler).token.line = uVar15;
        *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar12;
        pSVar3 = &(vm->compiler).scanner;
        pcStack_70 = (code *)0x106b39;
        scan_token(&local_60,pSVar3);
        (vm->compiler).next.length = local_60.length;
        (vm->compiler).next.line = local_60.line;
        *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
        (vm->compiler).next.type = local_60.type;
        *(undefined4 *)&(vm->compiler).next.field_0x4 = local_60._4_4_;
        (vm->compiler).next.start = local_60.start;
        if (((vm->compiler).next.type != TOKEN_COLON) &&
           ((((Compiler *)pVVar24)->token).type != TOKEN_CLOSE_BRACE)) {
          return;
        }
        pcStack_70 = (code *)0x106b8a;
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,' ');
        TVar17 = (vm->compiler).token.type;
        if ((TVar17 != TOKEN_CLOSE_BRACE) && (TVar17 != TOKEN_EOF)) {
          pTVar1 = &(vm->compiler).previous;
          pTVar2 = &(vm->compiler).next;
          while( true ) {
            pcStack_70 = (code *)0x106ddf;
            string(vm,true);
            TVar17 = (((Compiler *)pVVar24)->token).type;
            uVar12 = *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4;
            pcVar23 = (((Compiler *)pVVar24)->token).start;
            uVar15 = (((Compiler *)pVVar24)->token).line;
            uVar11 = *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x1c;
            (vm->compiler).previous.length = (((Compiler *)pVVar24)->token).length;
            (vm->compiler).previous.line = uVar15;
            *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
            pTVar1->type = TVar17;
            *(undefined4 *)&pTVar1->field_0x4 = uVar12;
            (vm->compiler).previous.start = pcVar23;
            uVar11 = *(undefined4 *)&pTVar2->field_0x4;
            pcVar23 = (vm->compiler).next.start;
            sVar19 = (vm->compiler).next.length;
            uVar15 = (vm->compiler).next.line;
            uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
            (((Compiler *)pVVar24)->token).type = pTVar2->type;
            *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4 = uVar11;
            (((Compiler *)pVVar24)->token).start = pcVar23;
            (((Compiler *)pVVar24)->token).length = sVar19;
            (((Compiler *)pVVar24)->token).line = uVar15;
            *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x1c = uVar12;
            pcStack_70 = (code *)0x106e15;
            scan_token(&local_60,pSVar3);
            pVVar24 = local_38;
            (vm->compiler).next.length = local_60.length;
            (vm->compiler).next.line = local_60.line;
            *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
            pTVar2->type = local_60.type;
            *(undefined4 *)&pTVar2->field_0x4 = local_60._4_4_;
            (vm->compiler).next.start = local_60.start;
            pcStack_70 = (code *)0x106e43;
            consume(&local_60,vm,TOKEN_COLON,"Expected \':\' between key and value in dictionary");
            pcStack_70 = (code *)0x106e4b;
            expr(vm);
            pcStack_70 = (code *)0x106e6c;
            write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'#');
            if ((vm->compiler).token.type != TOKEN_COMMA) break;
            TVar17 = pVVar24->stack[0].type;
            uVar12 = *(undefined4 *)&pVVar24->stack[0].field_0x4;
            pcVar23 = ((Token *)pVVar24->stack)->start;
            uVar15 = *(uint32_t *)&pVVar24->stack[1].field_1;
            uVar11 = *(undefined4 *)((long)&pVVar24->stack[1].field_1 + 4);
            (vm->compiler).previous.length = ((Token *)pVVar24->stack)->length;
            (vm->compiler).previous.line = uVar15;
            *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
            pTVar1->type = TVar17;
            *(undefined4 *)&pTVar1->field_0x4 = uVar12;
            (vm->compiler).previous.start = pcVar23;
            uVar11 = *(undefined4 *)&pTVar2->field_0x4;
            pcVar23 = (vm->compiler).next.start;
            sVar19 = (vm->compiler).next.length;
            uVar15 = (vm->compiler).next.line;
            uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
            pVVar24->stack[0].type = pTVar2->type;
            *(undefined4 *)&pVVar24->stack[0].field_0x4 = uVar11;
            ((Token *)pVVar24->stack)->start = pcVar23;
            ((Token *)pVVar24->stack)->length = sVar19;
            *(uint32_t *)&pVVar24->stack[1].field_1 = uVar15;
            *(undefined4 *)((long)&pVVar24->stack[1].field_1 + 4) = uVar12;
            pcStack_70 = (code *)0x106eac;
            scan_token(&local_60,pSVar3);
            (vm->compiler).next.length = local_60.length;
            (vm->compiler).next.line = local_60.line;
            *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
            pTVar2->type = local_60.type;
            *(undefined4 *)&pTVar2->field_0x4 = local_60._4_4_;
            (vm->compiler).next.start = local_60.start;
          }
        }
        pcVar23 = "Expected \'}\' after dictionary literal";
        TVar17 = TOKEN_CLOSE_BRACE;
LAB_00106d4e:
        pcStack_70 = (code *)0x106d53;
        consume(&local_60,vm,TVar17,pcVar23);
        return;
      }
      if (TVar17 != TOKEN_TRUE) goto switchD_00106639_caseD_1;
      code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
      uVar21 = '\x01';
    }
    else if (TVar17 == TOKEN_FALSE) {
      code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
      uVar21 = '\x02';
    }
    else {
      if (TVar17 != TOKEN_NIL) {
        if (TVar17 == TOKEN_OPEN_BRACKET) {
          pcStack_70 = (code *)0x10671e;
          write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'!');
          pTVar1 = &(vm->compiler).previous;
          TVar17 = (((Compiler *)pVVar24)->token).type;
          uVar12 = *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4;
          pcVar23 = (vm->compiler).token.start;
          uVar15 = (vm->compiler).token.line;
          uVar11 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          (vm->compiler).previous.length = (vm->compiler).token.length;
          (vm->compiler).previous.line = uVar15;
          *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
          (vm->compiler).previous.type = TVar17;
          *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar12;
          (vm->compiler).previous.start = pcVar23;
          pTVar2 = &(vm->compiler).next;
          uVar11 = *(undefined4 *)&(vm->compiler).next.field_0x4;
          pcVar23 = (vm->compiler).next.start;
          sVar19 = (vm->compiler).next.length;
          uVar15 = (vm->compiler).next.line;
          uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (((Compiler *)pVVar24)->token).type = (vm->compiler).next.type;
          *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4 = uVar11;
          (vm->compiler).token.start = pcVar23;
          (vm->compiler).token.length = sVar19;
          (vm->compiler).token.line = uVar15;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar12;
          pSVar3 = &(vm->compiler).scanner;
          pcStack_70 = (code *)0x106770;
          scan_token(&local_60,pSVar3);
          (vm->compiler).next.length = local_60.length;
          (vm->compiler).next.line = local_60.line;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
          (vm->compiler).next.type = local_60.type;
          *(undefined4 *)&(vm->compiler).next.field_0x4 = local_60._4_4_;
          (vm->compiler).next.start = local_60.start;
          if ((vm->compiler).token.type == TOKEN_CLOSE_BRACKET) {
            TVar17 = (((Compiler *)pVVar24)->token).type;
            uVar12 = *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4;
            pcVar23 = (vm->compiler).token.start;
            uVar15 = (vm->compiler).token.line;
            uVar11 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
            (vm->compiler).previous.length = (vm->compiler).token.length;
            (vm->compiler).previous.line = uVar15;
            *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
            pTVar1->type = TVar17;
            *(undefined4 *)&pTVar1->field_0x4 = uVar12;
            (vm->compiler).previous.start = pcVar23;
            uVar11 = *(undefined4 *)&pTVar2->field_0x4;
            pcVar23 = (vm->compiler).next.start;
            sVar19 = (vm->compiler).next.length;
            uVar15 = (vm->compiler).next.line;
            uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
            (((Compiler *)pVVar24)->token).type = pTVar2->type;
            *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4 = uVar11;
            (vm->compiler).token.start = pcVar23;
            (vm->compiler).token.length = sVar19;
            (vm->compiler).token.line = uVar15;
            *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar12;
            pcStack_70 = (code *)0x1067cc;
            scan_token(&local_60,pSVar3);
            (vm->compiler).next.length = local_60.length;
            (vm->compiler).next.line = local_60.line;
            *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
            pTVar2->type = local_60.type;
            *(undefined4 *)&pTVar2->field_0x4 = local_60._4_4_;
            (vm->compiler).next.start = local_60.start;
            return;
          }
          while( true ) {
            pcStack_70 = (code *)0x1067ee;
            expr(vm);
            pcStack_70 = (code *)0x10680f;
            write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\"');
            if ((vm->compiler).token.type != TOKEN_COMMA) break;
            TVar17 = (((Compiler *)pVVar24)->token).type;
            uVar12 = *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4;
            pcVar23 = (vm->compiler).token.start;
            uVar15 = (vm->compiler).token.line;
            uVar11 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
            (vm->compiler).previous.length = (vm->compiler).token.length;
            (vm->compiler).previous.line = uVar15;
            *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
            pTVar1->type = TVar17;
            *(undefined4 *)&pTVar1->field_0x4 = uVar12;
            (vm->compiler).previous.start = pcVar23;
            uVar11 = *(undefined4 *)&pTVar2->field_0x4;
            pcVar23 = (vm->compiler).next.start;
            sVar19 = (vm->compiler).next.length;
            uVar15 = (vm->compiler).next.line;
            uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
            (((Compiler *)pVVar24)->token).type = pTVar2->type;
            *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4 = uVar11;
            (vm->compiler).token.start = pcVar23;
            (vm->compiler).token.length = sVar19;
            (vm->compiler).token.line = uVar15;
            *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar12;
            pcStack_70 = (code *)0x10684f;
            scan_token(&local_60,pSVar3);
            (vm->compiler).next.length = local_60.length;
            (vm->compiler).next.line = local_60.line;
            *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
            pTVar2->type = local_60.type;
            *(undefined4 *)&pTVar2->field_0x4 = local_60._4_4_;
            (vm->compiler).next.start = local_60.start;
          }
          pcVar23 = "Expected \']\' after list literal";
          TVar17 = TOKEN_CLOSE_BRACKET;
          goto LAB_00106d4e;
        }
        goto switchD_00106639_caseD_1;
      }
      code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
      uVar21 = '\x03';
    }
    pcStack_70 = (code *)0x106bf5;
    write_code_buffer(code_buffer,uVar21);
    puVar20 = &local_68;
    goto LAB_00106cd0;
  }
  switch(TVar17) {
  case TOKEN_OPEN_PAREN:
    TVar17 = (((Compiler *)pVVar24)->token).type;
    uVar12 = *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4;
    pcVar23 = (vm->compiler).token.start;
    uVar15 = (vm->compiler).token.line;
    uVar11 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar15;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
    (vm->compiler).previous.type = TVar17;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar12;
    (vm->compiler).previous.start = pcVar23;
    uVar11 = *(undefined4 *)&(vm->compiler).next.field_0x4;
    pcVar23 = (vm->compiler).next.start;
    sVar19 = (vm->compiler).next.length;
    uVar15 = (vm->compiler).next.line;
    uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (((Compiler *)pVVar24)->token).type = (vm->compiler).next.type;
    *(undefined4 *)&(((Compiler *)pVVar24)->token).field_0x4 = uVar11;
    (vm->compiler).token.start = pcVar23;
    (vm->compiler).token.length = sVar19;
    (vm->compiler).token.line = uVar15;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar12;
    pcStack_70 = (code *)0x10667c;
    scan_token(&local_60,&(vm->compiler).scanner);
    pVVar24 = local_38;
    (vm->compiler).next.length = local_60.length;
    (vm->compiler).next.line = local_60.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
    (vm->compiler).next.type = local_60.type;
    *(undefined4 *)&(vm->compiler).next.field_0x4 = local_60._4_4_;
    (vm->compiler).next.start = local_60.start;
    pcStack_70 = (code *)0x1066a3;
    expr(vm);
    puVar20 = &local_68;
    if ((vm->compiler).token.type == TOKEN_CLOSE_PAREN) goto LAB_00106cd0;
    uVar5 = (vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].cap;
    pcVar23 = "Expected \')\'";
    goto LAB_00106f12;
  case TOKEN_DEC_NUMBER:
    sVar6 = (vm->compiler).token.length;
    if (sVar6 == 1) {
      cVar22 = *(vm->compiler).token.start;
      if (cVar22 == '1') {
        pCVar7 = (vm->frames).frame_pointers[vm->frame_count - 1];
        uVar21 = '\x15';
      }
      else {
        if (cVar22 != '0') goto LAB_00106bfa;
        pCVar7 = (vm->frames).frame_pointers[vm->frame_count - 1];
        uVar21 = '\x14';
      }
      pcStack_70 = (code *)0x106ee9;
      write_code_buffer(&pCVar7->code_buffer,uVar21);
      pVVar24 = local_38;
      goto LAB_00106cd0;
    }
LAB_00106bfa:
    lVar8 = -(sVar6 + 0x10 & 0xfffffffffffffff0);
    __nptr = (char *)((long)&local_68 + lVar8);
    pcVar23 = (vm->compiler).token.start;
    local_40 = (undefined1 *)&local_68;
    *(undefined8 *)((long)&pcStack_70 + lVar8) = 0x106c21;
    memcpy(__nptr,pcVar23,sVar6);
    __nptr[sVar6] = '\0';
    *(undefined8 *)((long)&pcStack_70 + lVar8) = 0x106c30;
    value = strtod(__nptr,(char **)0x0);
    break;
  case TOKEN_HEX_NUMBER:
    sVar6 = (vm->compiler).token.length;
    lVar8 = -(sVar6 + 0x10 & 0xfffffffffffffff0);
    __nptr = (char *)((long)&local_68 + lVar8);
    pcVar23 = (vm->compiler).token.start;
    local_40 = (undefined1 *)&local_68;
    *(undefined8 *)((long)&pcStack_70 + lVar8) = 0x106a5b;
    memcpy(__nptr,pcVar23,sVar6);
    __nptr[sVar6] = '\0';
    *(undefined8 *)((long)&pcStack_70 + lVar8) = 0x106a6f;
    uVar16 = strtoul(__nptr,(char **)0x0,0x10);
    auVar27._8_4_ = (int)(uVar16 >> 0x20);
    auVar27._0_8_ = uVar16;
    auVar27._12_4_ = 0x45300000;
    value = (auVar27._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
    break;
  case TOKEN_STRING:
    pcStack_70 = (code *)0x106af0;
    string(vm,true);
    puVar20 = &local_68;
    goto LAB_00106cd0;
  default:
    if (TVar17 == TOKEN_IDENTIFIER) {
      pcStack_70 = (code *)0x1068bc;
      VVar28 = resolve_var(vm,(vm->compiler).token.start,(vm->compiler).token.length);
      auVar9 = VVar28._0_12_;
      uVar15 = vm->frame_count;
      if (uVar15 == VVar28.frame_offset) {
        pcStack_70 = (code *)0x1068ef;
        write_code_buffer(&(vm->frames).frame_pointers[uVar15 - 1]->code_buffer,'\x17');
        pcStack_70 = (code *)0x106913;
        local_68 = VVar28._0_8_;
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                          (uint8_t)VVar28.index);
        TVar17 = local_38->stack[0].type;
        uVar12 = *(undefined4 *)&local_38->stack[0].field_0x4;
        pcVar23 = ((Token *)local_38->stack)->start;
        uVar25 = *(uint32_t *)&local_38->stack[1].field_1;
        uVar11 = *(undefined4 *)((long)&local_38->stack[1].field_1 + 4);
        (vm->compiler).previous.length = ((Token *)local_38->stack)->length;
        (vm->compiler).previous.line = uVar25;
        *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
        (vm->compiler).previous.type = TVar17;
        *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar12;
        (vm->compiler).previous.start = pcVar23;
        uVar11 = *(undefined4 *)&(vm->compiler).next.field_0x4;
        pcVar23 = (vm->compiler).next.start;
        sVar19 = (vm->compiler).next.length;
        uVar25 = (vm->compiler).next.line;
        uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        local_38->stack[0].type = (vm->compiler).next.type;
        *(undefined4 *)&local_38->stack[0].field_0x4 = uVar11;
        ((Token *)local_38->stack)->start = pcVar23;
        ((Token *)local_38->stack)->length = sVar19;
        *(uint32_t *)&local_38->stack[1].field_1 = uVar25;
        *(undefined4 *)((long)&local_38->stack[1].field_1 + 4) = uVar12;
        pSVar3 = &(vm->compiler).scanner;
        pcStack_70 = (code *)0x10695b;
        local_40 = VVar28._8_8_;
        scan_token(&local_60,pSVar3);
        uVar25 = (uint32_t)local_40;
        (vm->compiler).next.length = local_60.length;
        (vm->compiler).next.line = local_60.line;
        *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
        (vm->compiler).next.type = local_60.type;
        *(undefined4 *)&(vm->compiler).next.field_0x4 = local_60._4_4_;
        (vm->compiler).next.start = local_60.start;
        TVar17 = (vm->compiler).token.type;
        if ((TVar17 == TOKEN_MINUS_MINUS) || (TVar17 == TOKEN_PLUS_PLUS)) {
          pTVar1 = &(vm->compiler).next;
          TVar17 = local_38->stack[0].type;
          uVar12 = *(undefined4 *)&local_38->stack[0].field_0x4;
          pcVar23 = ((Token *)local_38->stack)->start;
          uVar25 = *(uint32_t *)&local_38->stack[1].field_1;
          uVar11 = *(undefined4 *)((long)&local_38->stack[1].field_1 + 4);
          (vm->compiler).previous.length = ((Token *)local_38->stack)->length;
          (vm->compiler).previous.line = uVar25;
          *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
          (vm->compiler).previous.type = TVar17;
          *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar12;
          (vm->compiler).previous.start = pcVar23;
          uVar11 = *(undefined4 *)&pTVar1->field_0x4;
          pcVar23 = (vm->compiler).next.start;
          sVar19 = (vm->compiler).next.length;
          uVar25 = (vm->compiler).next.line;
          uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          local_38->stack[0].type = pTVar1->type;
          *(undefined4 *)&local_38->stack[0].field_0x4 = uVar11;
          ((Token *)local_38->stack)->start = pcVar23;
          ((Token *)local_38->stack)->length = sVar19;
          *(uint32_t *)&local_38->stack[1].field_1 = uVar25;
          *(undefined4 *)((long)&local_38->stack[1].field_1 + 4) = uVar12;
          pcStack_70 = (code *)0x1069d1;
          scan_token(&local_60,pSVar3);
          puVar13 = local_40;
          (vm->compiler).next.length = local_60.length;
          (vm->compiler).next.line = local_60.line;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
          pTVar1->type = local_60.type;
          *(undefined4 *)&pTVar1->field_0x4 = local_60._4_4_;
          (vm->compiler).next.start = local_60.start;
          if (((ulong)local_40 >> 0x20 & 1) == 0) {
            cVar22 = -1;
            pcStack_70 = string;
            pVVar24 = local_38;
            error((Compiler *)local_38,"Cannot increment value");
            ppcVar4 = &(pVVar24->compiler).token.start;
            key = *(HTItemKey *)ppcVar4;
            pcStack_70 = (code *)&stack0xfffffffffffffff8;
            CVar29 = ht_get(&pVVar24->strings,*(HTItemKey *)ppcVar4);
            if (CVar29.type == NIL) {
              pcVar23 = (pVVar24->compiler).token.start;
              if (cVar22 == '\0') {
                sVar19 = (pVVar24->compiler).token.length;
              }
              else {
                pcVar23 = pcVar23 + 1;
                sVar19 = (pVVar24->compiler).token.length - 2;
              }
              object = new_string(pVVar24,pcVar23,sVar19);
              CVar29 = create_object(&object->object);
              aVar18 = CVar29.field_1;
              VVar14 = CVar29.type;
              CVar29._4_4_ = 0;
              CVar29.type = VVar14;
              CVar29.field_1.p_value = aVar18.p_value;
              ht_put(&pVVar24->strings,key,CVar29);
            }
            else {
              CVar29 = create_object(CVar29.field_1.o_value);
              aVar18 = CVar29.field_1;
              VVar14 = CVar29.type;
            }
            value_01._4_4_ = 0;
            value_01.type = VVar14;
            value_01.field_1.p_value = aVar18.p_value;
            uVar15 = add_constant(pVVar24,value_01);
            if ((uVar15 & 0xff00) == 0) {
              uVar21 = '\x12';
            }
            else {
              uVar21 = (uint8_t)(uVar15 >> 8);
              write_code_buffer(&(pVVar24->frames).frame_pointers[pVVar24->frame_count - 1]->
                                 code_buffer,'\x13');
            }
            pppCVar26 = &(pVVar24->frames).frame_pointers;
            write_code_buffer(&(*pppCVar26)[pVVar24->frame_count - 1]->code_buffer,uVar21);
            write_code_buffer(&(*pppCVar26)[pVVar24->frame_count - 1]->code_buffer,(uint8_t)uVar15);
            return;
          }
          pcStack_70 = (code *)0x106a24;
          write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                            ((vm->compiler).previous.type != TOKEN_PLUS_PLUS) + '/');
          auVar10._8_8_ = puVar13;
          auVar10._0_8_ = local_68;
          auVar9 = auVar10._0_12_;
          goto LAB_00106d92;
        }
      }
      else {
        pcStack_70 = (code *)0x106d72;
        write_code_buffer(&(vm->frames).frame_pointers[uVar15 - 1]->code_buffer,'\x18');
        pcStack_70 = (code *)0x106d92;
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                          (uint8_t)VVar28.frame_offset);
LAB_00106d92:
        uVar25 = auVar9._8_4_;
        pcStack_70 = (code *)0x106db2;
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,auVar9[0]);
      }
      puVar20 = &local_68;
      pVVar24 = local_38;
      if (uVar15 == uVar25) {
        return;
      }
      goto LAB_00106cd0;
    }
  case TOKEN_CLOSE_PAREN:
switchD_00106639_caseD_1:
    uVar5 = (vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].cap;
    pcVar23 = "Unexpected Token";
LAB_00106f12:
    pcStack_70 = (code *)0x106f19;
    printf("[Line %d] %s\n",(ulong)uVar5,pcVar23);
    pcStack_70 = (code *)0x106f2a;
    longjmp((__jmp_buf_tag *)error_buf,2);
  }
  builtin_strncpy(__nptr + -8,"5l\x10",4);
  __nptr[-4] = '\0';
  __nptr[-3] = '\0';
  __nptr[-2] = '\0';
  __nptr[-1] = '\0';
  CVar29 = create_number(value);
  value_00.field_1 = CVar29.field_1;
  value_00._4_4_ = 0;
  value_00.type = CVar29.type;
  builtin_strncpy(__nptr + -8,"?l\x10",4);
  __nptr[-4] = '\0';
  __nptr[-3] = '\0';
  __nptr[-2] = '\0';
  __nptr[-1] = '\0';
  uVar15 = add_constant(vm,value_00);
  if ((uVar15 & 0xff00) == 0) {
    uVar21 = '\x12';
  }
  else {
    uVar21 = (uint8_t)(uVar15 >> 8);
    pCVar7 = (vm->frames).frame_pointers[vm->frame_count - 1];
    builtin_strncpy(__nptr + -8,"\x7fl\x10",4);
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    write_code_buffer(&pCVar7->code_buffer,'\x13');
  }
  pppCVar26 = &(vm->frames).frame_pointers;
  pCVar7 = (*pppCVar26)[vm->frame_count - 1];
  __nptr[-8] = -0x53;
  __nptr[-7] = 'l';
  __nptr[-6] = '\x10';
  __nptr[-5] = '\0';
  __nptr[-4] = '\0';
  __nptr[-3] = '\0';
  __nptr[-2] = '\0';
  __nptr[-1] = '\0';
  write_code_buffer(&pCVar7->code_buffer,uVar21);
  pCVar7 = (*pppCVar26)[vm->frame_count - 1];
  __nptr[-8] = -0x38;
  __nptr[-7] = 'l';
  __nptr[-6] = '\x10';
  __nptr[-5] = '\0';
  __nptr[-4] = '\0';
  __nptr[-3] = '\0';
  __nptr[-2] = '\0';
  __nptr[-1] = '\0';
  write_code_buffer(&pCVar7->code_buffer,(uint8_t)uVar15);
  puVar20 = (undefined8 *)local_40;
  pVVar24 = local_38;
LAB_00106cd0:
  TVar17 = pVVar24->stack[0].type;
  uVar12 = *(undefined4 *)&pVVar24->stack[0].field_0x4;
  pcVar23 = ((Token *)pVVar24->stack)->start;
  uVar15 = *(uint32_t *)&pVVar24->stack[1].field_1;
  uVar11 = *(undefined4 *)((long)&pVVar24->stack[1].field_1 + 4);
  (vm->compiler).previous.length = ((Token *)pVVar24->stack)->length;
  (vm->compiler).previous.line = uVar15;
  *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar11;
  (vm->compiler).previous.type = TVar17;
  *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar12;
  (vm->compiler).previous.start = pcVar23;
  uVar11 = *(undefined4 *)&(vm->compiler).next.field_0x4;
  pcVar23 = (vm->compiler).next.start;
  sVar19 = (vm->compiler).next.length;
  uVar15 = (vm->compiler).next.line;
  uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
  pVVar24->stack[0].type = (vm->compiler).next.type;
  *(undefined4 *)&pVVar24->stack[0].field_0x4 = uVar11;
  ((Token *)pVVar24->stack)->start = pcVar23;
  ((Token *)pVVar24->stack)->length = sVar19;
  *(uint32_t *)&pVVar24->stack[1].field_1 = uVar15;
  *(undefined4 *)((long)&pVVar24->stack[1].field_1 + 4) = uVar12;
  *(undefined8 *)((long)puVar20 + -8) = 0x106d11;
  scan_token(&local_60,&(vm->compiler).scanner);
  (vm->compiler).next.length = local_60.length;
  (vm->compiler).next.line = local_60.line;
  *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
  (vm->compiler).next.type = local_60.type;
  *(undefined4 *)&(vm->compiler).next.field_0x4 = local_60._4_4_;
  (vm->compiler).next.start = local_60.start;
  return;
}

Assistant:

static void primary(Vm *vm) {
    Compiler *compiler = &vm->compiler;

    switch (compiler->token.type) {
        case TOKEN_DEC_NUMBER: {
            Token token = compiler->token;
            if (token.length == 1) {
                if (*token.start == '0') {
                    emit_no_arg(vm, OP_LDC_0);
                    break;
                } else if (*compiler->token.start == '1') {
                    emit_no_arg(vm, OP_LDC_1);
                    break;
                }
            }

            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            double res;

            res = strtod(str, NULL);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_HEX_NUMBER: {
            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            uint64_t res;

            res = strtoul(str, NULL, 16);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_OPEN_PAREN: {
            advance(vm);
            expr(vm);
            if (vm->compiler.token.type != TOKEN_CLOSE_PAREN) {
                error(&vm->compiler, "Expected ')'");
            }
            break;
        }
        case TOKEN_IDENTIFIER: {
            Variable var = resolve_var(vm, compiler->token.start, compiler->token.length);
            if (var.frame_offset != vm->frame_count) {
                // TODO bigger numbers
                emit_short_arg(vm, OP_LOAD_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
                break;
            }
            emit_byte_arg(vm, OP_LOAD, (uint8_t) var.index);

            advance(vm);

            if (compiler->token.type == TOKEN_PLUS_PLUS || compiler->token.type == TOKEN_MINUS_MINUS) {
                advance(vm);

                if (!var.assignable) {
                    error(compiler, "Cannot increment value");
                }

                // TODO bigger numbers
                emit_byte_arg(vm, compiler->previous.type == TOKEN_PLUS_PLUS ? OP_INC_1 : OP_DEC_1,
                              (uint8_t) var.index);
            }

            // already advanced
            return;
        }
        case TOKEN_OPEN_BRACKET: {
            emit_no_arg(vm, OP_LIST_NEW);
            advance(vm);

            if (!match(vm, TOKEN_CLOSE_BRACKET)) {
                do {
                    expr(vm);
                    emit_no_arg(vm, OP_LIST_APPEND);
                } while (match(vm, TOKEN_COMMA));

                consume(vm, TOKEN_CLOSE_BRACKET, "Expected ']' after list literal");
            }
            return;
        }
        case TOKEN_OPEN_BRACE: {
            advance(vm);
            // a dictionary, not a block
            if (compiler->next.type == TOKEN_COLON || compiler->token.type == TOKEN_CLOSE_BRACE) {
                emit_no_arg(vm, OP_DICT_NEW);

                if (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
                    do {
                        // consume key
                        string(vm, true);
                        advance(vm);
                        consume(vm, TOKEN_COLON, "Expected ':' between key and value in dictionary");
                        // consume value
                        expr(vm);

                        emit_no_arg(vm, OP_STRUCT_SET);
                    } while (match(vm, TOKEN_COMMA));
                }

                consume(vm, TOKEN_CLOSE_BRACE, "Expected '}' after dictionary literal");
            }

            return;
        }
        case TOKEN_STRING: {
            string(vm, true);
            break;
        }
        case TOKEN_FALSE:
            emit_no_arg(vm, OP_FALSE);
            break;
        case TOKEN_TRUE:
            emit_no_arg(vm, OP_TRUE);
            break;
        case TOKEN_NIL:
            emit_no_arg(vm, OP_NIL);
            break;
        default:
            error(&vm->compiler, "Unexpected Token");
            break;
    }

    advance(vm);
}